

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybi13.hpp
# Opt level: O2

error_code __thiscall
websocketpp::processor::hybi13<websocketpp::config::asio>::process_handshake
          (hybi13<websocketpp::config::asio> *this,request_type *request,string *subprotocol,
          response_type *response)

{
  string *psVar1;
  error_category *peVar2;
  error_code eVar3;
  string server_key;
  allocator local_8a;
  allocator local_89;
  string local_88;
  string local_68;
  string local_48;
  
  std::__cxx11::string::string((string *)&local_88,"Sec-WebSocket-Key",(allocator *)&local_68);
  psVar1 = http::parser::parser::get_header(&request->super_parser,&local_88);
  std::__cxx11::string::string((string *)&local_48,(string *)psVar1);
  std::__cxx11::string::~string((string *)&local_88);
  eVar3 = process_handshake_key(this,&local_48);
  peVar2 = eVar3._M_cat;
  if (eVar3._M_value == 0) {
    std::__cxx11::string::string((string *)&local_88,"Sec-WebSocket-Accept",(allocator *)&local_68);
    http::parser::parser::replace_header(&response->super_parser,&local_88,&local_48);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::string((string *)&local_88,"Upgrade",&local_89);
    std::__cxx11::string::string((string *)&local_68,"websocket",&local_8a);
    http::parser::parser::append_header(&response->super_parser,&local_88,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::string((string *)&local_88,"Connection",&local_89);
    std::__cxx11::string::string((string *)&local_68,"Upgrade",&local_8a);
    http::parser::parser::append_header(&response->super_parser,&local_88,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    if (subprotocol->_M_string_length != 0) {
      std::__cxx11::string::string
                ((string *)&local_88,"Sec-WebSocket-Protocol",(allocator *)&local_68);
      http::parser::parser::replace_header(&response->super_parser,&local_88,subprotocol);
      std::__cxx11::string::~string((string *)&local_88);
    }
    peVar2 = (error_category *)std::_V2::system_category();
  }
  std::__cxx11::string::~string((string *)&local_48);
  eVar3._4_4_ = 0;
  eVar3._M_cat = peVar2;
  return eVar3;
}

Assistant:

lib::error_code process_handshake(request_type const & request, 
        std::string const & subprotocol, response_type & response) const
    {
        std::string server_key = request.get_header("Sec-WebSocket-Key");

        lib::error_code ec = process_handshake_key(server_key);

        if (ec) {
            return ec;
        }

        response.replace_header("Sec-WebSocket-Accept",server_key);
        response.append_header("Upgrade",constants::upgrade_token);
        response.append_header("Connection",constants::connection_token);

        if (!subprotocol.empty()) {
            response.replace_header("Sec-WebSocket-Protocol",subprotocol);
        }

        return lib::error_code();
    }